

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

void __thiscall
FIX::DataDictionary::MessageFieldsOrderHolder::~MessageFieldsOrderHolder
          (MessageFieldsOrderHolder *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_orderedFlds).super__Vector_base<int,_std::allocator<int>_>);
  shared_array<int>::~shared_array(&(this->m_msgOrder).m_groupOrder);
  return;
}

Assistant:

~MessageFieldsOrderHolder() {}